

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedLinearAllocator.hpp
# Opt level: O1

void * __thiscall
Diligent::FixedLinearAllocator::Allocate(FixedLinearAllocator *this,size_t size,size_t alignment)

{
  pointer pDVar1;
  uint8_t *puVar2;
  char (*Args_1) [25];
  pointer in_R8;
  size_t sVar3;
  string msg;
  _Alloc_hider in_stack_ffffffffffffffa8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  ulong local_38;
  size_t local_30;
  size_t local_28;
  
  local_30 = alignment;
  local_28 = size;
  if ((size != 0) && (this->m_pDataStart == (uint8_t *)0x0)) {
    FormatString<char[30]>
              ((string *)&stack0xffffffffffffffa8,(char (*) [30])"Memory has not been allocated");
    DebugAssertionFailed
              (in_stack_ffffffffffffffa8._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
               ,0xe0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffa8._M_p != &local_48) {
      operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
    }
  }
  if ((local_30 ^ local_30 - 1) <= local_30 - 1) {
    FormatString<char[33]>
              ((string *)&stack0xffffffffffffffa8,(char (*) [33])"Alignment is not a power of two!")
    ;
    DebugAssertionFailed
              (in_stack_ffffffffffffffa8._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
               ,0xe1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffa8._M_p != &local_48) {
      operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
    }
  }
  sVar3 = local_28;
  if (local_28 == 0) {
    puVar2 = (uint8_t *)0x0;
  }
  else {
    local_38 = local_30;
    if ((local_30 ^ local_30 - 1) <= local_30 - 1) {
      FormatString<char[12],unsigned_long,char[23]>
                ((string *)&stack0xffffffffffffffa8,(Diligent *)"Alignment (",
                 (char (*) [12])&local_38,(unsigned_long *)") must be a power of 2",
                 (char (*) [23])in_R8);
      DebugAssertionFailed
                (in_stack_ffffffffffffffa8._M_p,"AlignUp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                 ,0x34);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_ffffffffffffffa8._M_p != &local_48) {
        operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
      }
    }
    Args_1 = (char (*) [25])(sVar3 + local_38 + -1);
    local_28 = -local_38 & (ulong)Args_1;
    if (this->m_DbgUsingExternalMemory == false) {
      if ((ulong)(((long)(this->m_DbgAllocations).
                         super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_DbgAllocations).
                         super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <=
          this->m_DbgCurrAllocation) {
        FormatString<char[82]>
                  ((string *)&stack0xffffffffffffffa8,
                   (char (*) [82])
                   "Allocation number exceed the number of allocations that were originally reserved."
                  );
        DebugAssertionFailed
                  (in_stack_ffffffffffffffa8._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                   ,0xec);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_ffffffffffffffa8._M_p != &local_48) {
          operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
        }
      }
      sVar3 = this->m_DbgCurrAllocation;
      pDVar1 = (this->m_DbgAllocations).
               super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      this->m_DbgCurrAllocation = sVar3 + 1;
      pDVar1 = pDVar1 + sVar3;
      if (pDVar1->size != local_28) {
        in_R8 = pDVar1;
        FormatString<char[18],unsigned_long,char[48],unsigned_long,char[2]>
                  ((string *)&stack0xffffffffffffffa8,(Diligent *)"Allocation size (",
                   (char (*) [18])&local_28,
                   (unsigned_long *)") does not match the initially requested size (",
                   (char (*) [48])pDVar1,(unsigned_long *)0x752f31,
                   (char (*) [2])in_stack_ffffffffffffffa8._M_p);
        DebugAssertionFailed
                  (in_stack_ffffffffffffffa8._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                   ,0xee);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_ffffffffffffffa8._M_p != &local_48) {
          operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
        }
      }
      if (pDVar1->alignment != local_30) {
        in_R8 = (pointer)&pDVar1->alignment;
        FormatString<char[23],unsigned_long,char[53],unsigned_long,char[2]>
                  ((string *)&stack0xffffffffffffffa8,(Diligent *)"Allocation alignment (",
                   (char (*) [23])&local_30,
                   (unsigned_long *)") does not match the initially requested alignment (",
                   (char (*) [53])in_R8,(unsigned_long *)0x752f31,
                   (char (*) [2])in_stack_ffffffffffffffa8._M_p);
        DebugAssertionFailed
                  (in_stack_ffffffffffffffa8._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                   ,0xef);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_ffffffffffffffa8._M_p != &local_48) {
          operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
        }
      }
      sVar3 = pDVar1->reserved_size;
    }
    else {
      if ((this->m_DbgAllocations).
          super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->m_DbgAllocations).
          super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        FormatString<char[26],char[25]>
                  ((string *)&stack0xffffffffffffffa8,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"m_DbgAllocations.empty()",Args_1);
        DebugAssertionFailed
                  (in_stack_ffffffffffffffa8._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                   ,0xf5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_ffffffffffffffa8._M_p != &local_48) {
          operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
        }
      }
      sVar3 = 0;
    }
    puVar2 = this->m_pCurrPtr;
    local_38 = this->m_CurrAlignment;
    if ((local_38 ^ local_38 - 1) <= local_38 - 1) {
      FormatString<char[12],unsigned_long,char[23]>
                ((string *)&stack0xffffffffffffffa8,(Diligent *)"Alignment (",
                 (char (*) [12])&local_38,(unsigned_long *)") must be a power of 2",
                 (char (*) [23])in_R8);
      DebugAssertionFailed
                (in_stack_ffffffffffffffa8._M_p,"AlignUp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                 ,0x34);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_ffffffffffffffa8._M_p != &local_48) {
        operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
      }
    }
    if (this->m_pCurrPtr != (uint8_t *)(-local_38 & (ulong)(puVar2 + (local_38 - 1)))) {
      FormatString<char[43]>
                ((string *)&stack0xffffffffffffffa8,
                 (char (*) [43])"Current pointer is not aligned as expected");
      DebugAssertionFailed
                (in_stack_ffffffffffffffa8._M_p,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                 ,0xf9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_ffffffffffffffa8._M_p != &local_48) {
        operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
      }
    }
    puVar2 = this->m_pCurrPtr;
    local_38 = local_30;
    if ((local_30 ^ local_30 - 1) <= local_30 - 1) {
      FormatString<char[12],unsigned_long,char[23]>
                ((string *)&stack0xffffffffffffffa8,(Diligent *)"Alignment (",
                 (char (*) [12])&local_38,(unsigned_long *)") must be a power of 2",
                 (char (*) [23])in_R8);
      DebugAssertionFailed
                (in_stack_ffffffffffffffa8._M_p,"AlignUp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                 ,0x34);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_ffffffffffffffa8._M_p != &local_48) {
        operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
      }
    }
    puVar2 = (uint8_t *)(-local_38 & (ulong)(puVar2 + (local_38 - 1)));
    this->m_pCurrPtr = puVar2;
    this->m_CurrAlignment = local_30;
    if ((this->m_DbgUsingExternalMemory == false) &&
       (this->m_pDataStart + sVar3 < puVar2 + local_28)) {
      FormatString<char[76]>
                ((string *)&stack0xffffffffffffffa8,
                 (char (*) [76])
                 "Allocation size exceeds the initially reserved space. This is likely a bug.");
      DebugAssertionFailed
                (in_stack_ffffffffffffffa8._M_p,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                 ,0xfe);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_ffffffffffffffa8._M_p != &local_48) {
        operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
      }
    }
    puVar2 = this->m_pCurrPtr;
    this->m_pCurrPtr = puVar2 + local_28;
    if (this->m_pDataStart + this->m_ReservedSize < puVar2 + local_28) {
      FormatString<char[43]>
                ((string *)&stack0xffffffffffffffa8,
                 (char (*) [43])"Allocation size exceeds the reserved space");
      DebugAssertionFailed
                (in_stack_ffffffffffffffa8._M_p,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                 ,0x103);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_ffffffffffffffa8._M_p != &local_48) {
        operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
      }
    }
  }
  return puVar2;
}

Assistant:

NODISCARD void* Allocate(size_t size, size_t alignment = 1)
    {
        VERIFY(size == 0 || m_pDataStart != nullptr, "Memory has not been allocated");
        VERIFY(IsPowerOfTwo(alignment), "Alignment is not a power of two!");

        if (size == 0)
            return nullptr;

        size = AlignUp(size, alignment);

#if DILIGENT_DEBUG
        size_t dbgReservedSize = 0;
        if (!m_DbgUsingExternalMemory)
        {
            VERIFY(m_DbgCurrAllocation < m_DbgAllocations.size(), "Allocation number exceed the number of allocations that were originally reserved.");
            const auto& CurrAllocation = m_DbgAllocations[m_DbgCurrAllocation++];
            VERIFY(CurrAllocation.size == size, "Allocation size (", size, ") does not match the initially requested size (", CurrAllocation.size, ")");
            VERIFY(CurrAllocation.alignment == alignment, "Allocation alignment (", alignment, ") does not match the initially requested alignment (", CurrAllocation.alignment, ")");
            dbgReservedSize = CurrAllocation.reserved_size;
        }
        else
        {
            // Allocating in place in assigned memory
            VERIFY_EXPR(m_DbgAllocations.empty());
        }
#endif

        VERIFY(AlignUp(m_pCurrPtr, m_CurrAlignment) == m_pCurrPtr, "Current pointer is not aligned as expected");
        m_pCurrPtr      = AlignUp(m_pCurrPtr, alignment);
        m_CurrAlignment = alignment;

        VERIFY(m_DbgUsingExternalMemory || m_pCurrPtr + size <= m_pDataStart + dbgReservedSize,
               "Allocation size exceeds the initially reserved space. This is likely a bug.");

        auto* ptr = m_pCurrPtr;
        m_pCurrPtr += size;

        VERIFY(m_pCurrPtr <= m_pDataStart + m_ReservedSize, "Allocation size exceeds the reserved space");

        return ptr;
    }